

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void InitGLRMapinfoData(void)

{
  level_info_t *plVar1;
  Node *pNVar2;
  uint uVar3;
  Node *pNVar4;
  FOptionalMapinfoData *pFVar5;
  byte bVar6;
  
  plVar1 = level.info;
  uVar3 = FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pNVar2 = (plVar1->optdata).Nodes + ((plVar1->optdata).Size - 1 & uVar3);
  while ((pNVar4 = pNVar2, pNVar4 != (Node *)0x0 && (pNVar4->Next != (Node *)0x1))) {
    pNVar2 = pNVar4->Next;
    if ((pNVar4->Pair).Key.Index == uVar3) {
LAB_0036dc7b:
      if (pNVar4 == (Node *)0x0) {
        pFVar5 = (FOptionalMapinfoData *)0x0;
      }
      else {
        pFVar5 = (pNVar4->Pair).Value.Ptr;
      }
      if (pFVar5 == (FOptionalMapinfoData *)0x0) {
        gl_SetFogParams(0,(PalEntry)(level.info)->outsidefog,0,0);
        glset.map_lightmode = -1;
        glset.map_nocoloredspritelighting = -1;
        glset.map_notexturefill = -1;
        glset.map_brightfog = -1;
        glset.skyrotatevector.X = 0.0;
        glset.skyrotatevector.Y = 0.0;
        glset.skyrotatevector.Z = 1.0;
        glset.skyrotatevector2.Z = 1.0;
        glset.skyrotatevector2.X = 0.0;
        glset.skyrotatevector2.Y = 0.0;
        glset.pixelstretch = 1.2;
      }
      else {
        gl_SetFogParams(*(int *)&pFVar5->field_0x14,(PalEntry)(level.info)->outsidefog,
                        *(int *)&pFVar5[1]._vptr_FOptionalMapinfoData,
                        *(int *)((long)&pFVar5[1]._vptr_FOptionalMapinfoData + 4));
        glset.map_nocoloredspritelighting = (SBYTE)pFVar5[1].identifier.Index;
        glset.map_lightmode = *(SBYTE *)&pFVar5[1].Next;
        glset.map_notexturefill = *(SBYTE *)((long)&pFVar5[1].identifier.Index + 1);
        glset.map_brightfog = *(undefined1 *)((long)&pFVar5[1].Next + 4);
        glset.skyrotatevector._4_8_ = pFVar5[2]._vptr_FOptionalMapinfoData;
        glset.skyrotatevector.X = *(float *)&pFVar5[1].field_0x14;
        glset.skyrotatevector2.Z = (float)pFVar5[2].identifier.Index;
        glset.skyrotatevector2._0_8_ = pFVar5[2].Next;
        glset.pixelstretch = *(float *)&pFVar5[2].field_0x14;
      }
      glset.lightmode = (SBYTE)gl_lightmode.Value;
      if (((byte)glset.map_lightmode < 9) &&
         ((0x11fU >> ((byte)glset.map_lightmode & 0x1f) & 1) != 0)) {
        glset.lightmode = (&DAT_00721a79)[(uint)(byte)glset.map_lightmode];
      }
      bVar6 = glset.map_nocoloredspritelighting != '\0';
      if (glset.map_nocoloredspritelighting == -1) {
        bVar6 = gl_nocoloredspritelighting.Value;
      }
      glset.nocoloredspritelighting = (bool)(bVar6 & 1);
      bVar6 = glset.map_notexturefill != '\0';
      if (glset.map_notexturefill == -1) {
        bVar6 = gl_notexturefill.Value;
      }
      glset.notexturefill = (bool)(bVar6 & 1);
      bVar6 = glset.map_brightfog != '\0';
      if (glset.map_brightfog == -1) {
        bVar6 = gl_brightfog.Value;
      }
      glset.brightfog = (bool)(bVar6 & 1);
      return;
    }
  }
  pNVar4 = (Node *)0x0;
  goto LAB_0036dc7b;
}

Assistant:

void InitGLRMapinfoData()
{
	FGLROptions *opt = level.info->GetOptData<FGLROptions>("gl_renderer", false);

	if (opt != NULL)
	{
		gl_SetFogParams(opt->fogdensity, level.info->outsidefog, opt->outsidefogdensity, opt->skyfog);
		glset.map_lightmode = opt->lightmode;
		glset.map_brightfog = opt->brightfog;
		glset.map_nocoloredspritelighting = opt->nocoloredspritelighting;
		glset.map_notexturefill = opt->notexturefill;
		glset.skyrotatevector = opt->skyrotatevector;
		glset.skyrotatevector2 = opt->skyrotatevector2;
		glset.pixelstretch = opt->pixelstretch;
	}
	else
	{
		gl_SetFogParams(0, level.info->outsidefog, 0, 0);
		glset.map_lightmode = -1;
		glset.map_brightfog = -1;
		glset.map_nocoloredspritelighting = -1;
		glset.map_notexturefill = -1;
		glset.skyrotatevector = FVector3(0,0,1);
		glset.skyrotatevector2 = FVector3(0,0,1);
		glset.pixelstretch = 1.2f;
	}

	if (!IsLightmodeValid()) glset.lightmode = gl_lightmode;
	else glset.lightmode = glset.map_lightmode;
	if (glset.map_nocoloredspritelighting == -1) glset.nocoloredspritelighting = gl_nocoloredspritelighting;
	else glset.nocoloredspritelighting = !!glset.map_nocoloredspritelighting;
	if (glset.map_notexturefill == -1) glset.notexturefill = gl_notexturefill;
	else glset.notexturefill = !!glset.map_notexturefill;
	if (glset.map_brightfog == -1) glset.brightfog = gl_brightfog;
	else glset.brightfog = !!glset.map_brightfog;
}